

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_executor.cpp
# Opt level: O3

TaskExecutionResult __thiscall
duckdb::BaseExecutorTask::Execute(BaseExecutorTask *this,TaskExecutionMode mode)

{
  atomic<unsigned_long> *paVar1;
  TaskNotifier task_notifier;
  TaskNotifier aTStack_138 [36];
  
  if (((this->executor->error_manager).has_error._M_base._M_i & 1U) == 0) {
    TaskNotifier::TaskNotifier(aTStack_138,(this->executor->context).ptr);
    (*(this->super_Task)._vptr_Task[6])(this);
    LOCK();
    paVar1 = &this->executor->completed_tasks;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    TaskNotifier::~TaskNotifier(aTStack_138);
  }
  else {
    LOCK();
    paVar1 = &this->executor->completed_tasks;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
  }
  return TASK_FINISHED;
}

Assistant:

TaskExecutionResult BaseExecutorTask::Execute(TaskExecutionMode mode) {
	if (executor.HasError()) {
		// another task encountered an error - bailout
		executor.FinishTask();
		return TaskExecutionResult::TASK_FINISHED;
	}
	try {
		TaskNotifier task_notifier {executor.context};
		ExecuteTask();
		executor.FinishTask();
		return TaskExecutionResult::TASK_FINISHED;
	} catch (std::exception &ex) {
		executor.PushError(ErrorData(ex));
	} catch (...) { // LCOV_EXCL_START
		executor.PushError(ErrorData("Unknown exception during Checkpoint!"));
	} // LCOV_EXCL_STOP
	executor.FinishTask();
	return TaskExecutionResult::TASK_ERROR;
}